

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserMhapTest_FormatError_Test::TestBody
          (BioparserMhapTest_FormatError_Test *this)

{
  Parser<bioparser::test::MhapOverlap> *pPVar1;
  allocator local_40 [16];
  AssertionResult gtest_ar;
  
  std::__cxx11::string::string((string *)&gtest_ar,"sample.paf",local_40);
  BioparserMhapTest::Setup(&this->super_BioparserMhapTest,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pPVar1 = (this->super_BioparserMhapTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<bioparser::test::MhapOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
           .super__Head_base<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_false>.
           _M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&gtest_ar,pPVar1,0xffffffffffffffff,1);
  std::
  vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  ::_M_move_assign(&(this->super_BioparserMhapTest).o,&gtest_ar);
  std::
  vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
  ::~vector((vector<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::MhapOverlap,_std::default_delete<bioparser::test::MhapOverlap>_>_>_>
             *)&gtest_ar);
  return;
}

Assistant:

TEST_F(BioparserMhapTest, FormatError) {
  Setup("sample.paf");
  try {
    o = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::MhapParser] error: invalid file format");
  }
}